

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O0

double __thiscall
S2PolylineSimplifier::GetSemiwidth
          (S2PolylineSimplifier *this,S2Point *p,S1ChordAngle r,int round_direction)

{
  double dVar1;
  double error;
  double semiwidth;
  double sin2_a;
  double sin2_r;
  double local_48;
  double a2;
  double r2;
  double DBL_ERR;
  S2Point *pSStack_28;
  int round_direction_local;
  S2Point *p_local;
  S2PolylineSimplifier *this_local;
  S1ChordAngle r_local;
  
  r2 = 1.1102230246251565e-16;
  DBL_ERR._4_4_ = round_direction;
  pSStack_28 = p;
  p_local = &this->src_;
  this_local = (S2PolylineSimplifier *)r.length2_;
  a2 = S1ChordAngle::length2((S1ChordAngle *)&this_local);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&sin2_r,&this->src_,pSStack_28);
  local_48 = S1ChordAngle::length2((S1ChordAngle *)&sin2_r);
  local_48 = local_48 - (double)DBL_ERR._4_4_ * 7.888609052210118e-31;
  if (a2 < local_48) {
    dVar1 = sqrt((a2 * (1.0 - a2 * 0.25)) / (local_48 * (1.0 - local_48 * 0.25)));
    dVar1 = asin(dVar1);
    r_local.length2_ =
         dVar1 + (double)DBL_ERR._4_4_ * (dVar1 * 1.887379141862766e-15 + 2.6645352591003757e-15);
  }
  else {
    r_local.length2_ = 3.141592653589793;
  }
  return r_local.length2_;
}

Assistant:

double S2PolylineSimplifier::GetSemiwidth(const S2Point& p, S1ChordAngle r,
                                          int round_direction) const {
  double constexpr DBL_ERR = 0.5 * DBL_EPSILON;

  // Using spherical trigonometry,
  //
  //   sin(semiwidth) = sin(r) / sin(a)
  //
  // where "a" is the angle between "src" and "p".  Rather than measuring
  // these angles, instead we measure the squared chord lengths through the
  // interior of the sphere (i.e., Cartersian distance).  Letting "r2" be the
  // squared chord distance corresponding to "r", and "a2" be the squared
  // chord distance corresponding to "a", we use the relationships
  //
  //    sin^2(r) = r2 (1 - r2 / 4)
  //    sin^2(a) = d2 (1 - d2 / 4)
  //
  // which follow from the fact that r2 = (2 * sin(r / 2)) ^ 2, etc.

  // "a2" has a relative error up to 5 * DBL_ERR, plus an absolute error of up
  // to 64 * DBL_ERR^2 (because "src" and "p" may differ from unit length by
  // up to 4 * DBL_ERR).  We can correct for the relative error later, but for
  // the absolute error we use "round_direction" to account for it now.
  double r2 = r.length2();
  double a2 = S1ChordAngle(src_, p).length2();
  a2 -= 64 * DBL_ERR * DBL_ERR * round_direction;
  if (a2 <= r2) return M_PI;  // The given disc contains "src".

  double sin2_r = r2 * (1 - 0.25 * r2);
  double sin2_a = a2 * (1 - 0.25 * a2);
  double semiwidth = asin(sqrt(sin2_r / sin2_a));

  // We compute bounds on the errors from all sources:
  //
  //   - The call to GetSemiwidth (this call).
  //   - The call to GetAngle that computes the center of the interval.
  //   - The call to GetAngle in Extend that tests whether a given point
  //     is an acceptable destination vertex.
  //
  // Summary of the errors in GetAngle:
  //
  // y_dir_ has no error.
  //
  // x_dir_ has a relative error of DBL_ERR in two components, a relative
  // error of 2 * DBL_ERR in the other component, plus an overall relative
  // length error of 4 * DBL_ERR (compared to y_dir_) because "src" is assumed
  // to be normalized only to within the tolerances of S2Point::Normalize().
  //
  // p.DotProd(y_dir_) has a relative error of 1.5 * DBL_ERR and an
  // absolute error of 1.5 * DBL_ERR * y_dir_.Norm().
  //
  // p.DotProd(x_dir_) has a relative error of 5.5 * DBL_ERR and an absolute
  // error of 3.5 * DBL_ERR * y_dir_.Norm() (noting that x_dir_ and y_dir_
  // have the same length to within a relative error of 4 * DBL_ERR).
  //
  // It's possible to show by taking derivatives that these errors can affect
  // the angle atan2(y, x) by up 7.093 * DBL_ERR radians.  Rounding up and
  // including the call to atan2 gives a final error bound of 10 * DBL_ERR.
  //
  // Summary of the errors in GetSemiwidth:
  //
  // The distance a2 has a relative error of 5 * DBL_ERR plus an absolute
  // error of 64 * DBL_ERR^2 because the points "src" and "p" may differ from
  // unit length (by up to 4 * DBL_ERR).  We have already accounted for the
  // absolute error above, leaving only the relative error.
  //
  // sin2_r has a relative error of 2 * DBL_ERR.
  //
  // sin2_a has a relative error of 12 * DBL_ERR assuming that a2 <= 2,
  // i.e. distance(src, p) <= 90 degrees.  (The relative error gets
  // arbitrarily larger as this distance approaches 180 degrees.)
  //
  // semiwidth has a relative error of 17 * DBL_ERR.
  //
  // Finally, (center +/- semiwidth) has a rounding error of up to 4 * DBL_ERR
  // because in theory, the result magnitude may be as large as 1.5 * M_PI
  // which is larger than 4.0.  This gives a total error of:
  double error = (2 * 10 + 4) * DBL_ERR + 17 * DBL_ERR * semiwidth;
  return semiwidth + round_direction * error;
}